

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

int Cut_ManMappingArea_rec(Cut_Man_t *p,int Node)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 0;
  if (p->vCutsMax != (Vec_Ptr_t *)0x0) {
    puVar3 = (uint *)Vec_PtrEntry(p->vCutsMax,Node);
    iVar4 = 0;
    if ((puVar3 != (uint *)0x0) && (uVar1 = *puVar3, (uVar1 & 0xf0000000) != 0x10000000)) {
      iVar4 = 0;
      for (uVar5 = 0; uVar5 < uVar1 >> 0x1c; uVar5 = uVar5 + 1) {
        iVar2 = Cut_ManMappingArea_rec(p,puVar3[uVar5 + 6]);
        iVar4 = iVar4 + iVar2;
        uVar1 = *puVar3;
      }
      Vec_PtrWriteEntry(p->vCutsMax,Node,(void *)0x0);
      iVar4 = iVar4 + 1;
    }
  }
  return iVar4;
}

Assistant:

int Cut_ManMappingArea_rec( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pCut;
    int i, Counter;
    if ( p->vCutsMax == NULL )
        return 0;
    pCut = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsMax, Node );
    if ( pCut == NULL || pCut->nLeaves == 1 )
        return 0;
    Counter = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        Counter += Cut_ManMappingArea_rec( p, pCut->pLeaves[i] );
    Vec_PtrWriteEntry( p->vCutsMax, Node, NULL );
    return 1 + Counter;
}